

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall jsonip::writer<false>::new_double(writer<false> *this,double d)

{
  pre(this);
  std::ostream::_M_insert<double>(d);
  this->comma = true;
  return;
}

Assistant:

void new_double(double d)
        {
            pre();
            os << d;
            comma = true;
        }